

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

ssize_t __thiscall
booster::locale::basic_message<wchar_t>::write
          (basic_message<wchar_t> *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  message_format<wchar_t> *pmVar2;
  long lVar3;
  char_type_conflict *pcVar4;
  ssize_t sVar5;
  pointer pwVar6;
  pointer pwVar7;
  undefined4 in_register_00000034;
  pointer pwVar8;
  
  pwVar8 = this->c_id_;
  if (pwVar8 == (pointer)0x0) {
    pwVar8 = (this->id_)._M_dataplus._M_p;
  }
  pwVar6 = (pointer)(this->context_)._M_string_length;
  if (pwVar6 != (pointer)0x0) {
    pwVar6 = (this->context_)._M_dataplus._M_p;
  }
  if (this->c_context_ != (pointer)0x0) {
    pwVar6 = this->c_context_;
  }
  pwVar7 = (pointer)(this->plural_)._M_string_length;
  if (pwVar7 != (pointer)0x0) {
    pwVar7 = (this->plural_)._M_dataplus._M_p;
  }
  if (this->c_plural_ != (pointer)0x0) {
    pwVar7 = this->c_plural_;
  }
  if (*pwVar8 == L'\0') {
    pcVar4 = write::empty_string;
  }
  else {
    bVar1 = std::has_facet<booster::locale::message_format<wchar_t>>
                      ((locale *)CONCAT44(in_register_00000034,__fd));
    if (bVar1) {
      pmVar2 = std::use_facet<booster::locale::message_format<wchar_t>>
                         ((locale *)CONCAT44(in_register_00000034,__fd));
      if (pwVar7 == (pointer)0x0) {
        lVar3 = (**(code **)(*(long *)pmVar2 + 0x10))
                          (pmVar2,(ulong)__buf & 0xffffffff,pwVar6,pwVar8);
      }
      else {
        lVar3 = (**(code **)(*(long *)pmVar2 + 0x18))
                          (pmVar2,(ulong)__buf & 0xffffffff,pwVar6,pwVar8,this->n_);
      }
      if (lVar3 != 0) {
        return lVar3;
      }
    }
    else {
      pmVar2 = (message_format<wchar_t> *)0x0;
    }
    pcVar4 = pwVar7;
    if (this->n_ == 1) {
      pcVar4 = pwVar8;
    }
    if (pwVar7 == (pointer)0x0) {
      pcVar4 = pwVar8;
    }
    if (bVar1) {
      sVar5 = (**(code **)(*(long *)pmVar2 + 0x28))
                        (pmVar2,pcVar4,__n,*(code **)(*(long *)pmVar2 + 0x28));
      return sVar5;
    }
  }
  return (ssize_t)pcVar4;
}

Assistant:

char_type const *write(std::locale const &loc,int domain_id,string_type &buffer) const
            {
                char_type const *translated = 0;
                static const char_type empty_string[1] = {0};

                char_type const *id = this->id();
                char_type const *context = this->context();
                char_type const *plural = this->plural();
                
                if(*id == 0)
                    return empty_string;
                
                facet_type const *facet = 0;
                if(std::has_facet<facet_type>(loc))
                    facet = &std::use_facet<facet_type>(loc);

                if(facet) { 
                    if(!plural) {
                        translated = facet->get(domain_id,context,id);
                    }
                    else {
                        translated = facet->get(domain_id,context,id,n_);
                    }
                }

                if(!translated) {
                    char_type const *msg = plural ? ( n_ == 1 ? id : plural) : id;

                    if(facet) {
                        translated = facet->convert(msg,buffer);
                    }
                    else {
                        translated = details::string_cast_traits<char_type>::cast(msg,buffer);
                    }
                }
                return translated;
            }